

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O1

void kj::_::Debug::log<char_const(&)[97],kj::_::DebugExpression<bool>&,double,int>
               (char *file,int line,LogSeverity severity,char *macroArgs,char (*params) [97],
               DebugExpression<bool> *params_1,double *params_2,int *params_3)

{
  long lVar1;
  undefined8 uVar2;
  undefined4 in_register_00000014;
  double *params_00;
  int *params_01;
  long lVar3;
  String *result;
  ArrayPtr<kj::String> in_stack_ffffffffffffff68;
  char *pcStack_88;
  String local_80;
  String local_68;
  String local_50;
  
  str<char_const(&)[97]>
            ((String *)&stack0xffffffffffffff68,(kj *)params,
             (char (*) [97])CONCAT44(in_register_00000014,severity));
  heapString(&local_80,5);
  if ((char *)local_80.content.size_ != (char *)0x0) {
    local_80.content.size_ = (size_t)local_80.content.ptr;
  }
  builtin_strncpy((char *)local_80.content.size_,"false",5);
  str<double&>(&local_68,(kj *)params_2,params_00);
  str<int&>(&local_50,(kj *)params_3,params_01);
  logInternal((Debug *)file,(char *)(ulong)(uint)line,severity,(LogSeverity)macroArgs,
              &stack0xffffffffffffff68,in_stack_ffffffffffffff68);
  lVar3 = 0x48;
  do {
    lVar1 = *(long *)(&stack0xffffffffffffff68 + lVar3);
    if (lVar1 != 0) {
      uVar2 = *(undefined8 *)(&stack0xffffffffffffff70 + lVar3);
      *(undefined8 *)(&stack0xffffffffffffff68 + lVar3) = 0;
      *(undefined8 *)(&stack0xffffffffffffff70 + lVar3) = 0;
      (**(code **)**(undefined8 **)((long)&pcStack_88 + lVar3))
                (*(undefined8 **)((long)&pcStack_88 + lVar3),lVar1,1,uVar2,uVar2,0);
    }
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  return;
}

Assistant:

void Debug::log(const char* file, int line, LogSeverity severity, const char* macroArgs,
                Params&&... params) {
  String argValues[sizeof...(Params)] = {str(params)...};
  logInternal(file, line, severity, macroArgs, arrayPtr(argValues, sizeof...(Params)));
}